

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

string * __thiscall
kratos::EventControl::to_string
          (string *__return_storage_ptr__,EventControl *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
          *var_str)

{
  InternalException *this_00;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  char (*local_1a8) [8];
  allocator<char> local_181;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
  *local_130;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
  *var_str_local;
  EventControl *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_118;
  basic_string_view<char> local_108;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_f8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_e8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_long>
  *vargs;
  char *local_d8;
  string *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_c8;
  basic_string_view<char> local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char (*local_70) [8];
  char *local_68;
  string *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_130 = var_str;
  var_str_local =
       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
        *)this;
  this_local = (EventControl *)__return_storage_ptr__;
  if (this->type == Delay) {
    local_d8 = "#{0}";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_long>
             *)this;
    local_d0 = __return_storage_ptr__;
    local_f8.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<unsigned_long_const&,char[5],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_long>
                     *)0x424997,(v7 *)this,(char (*) [5])var_str,
                    (remove_reference_t<const_unsigned_long_&> *)0x424997);
    local_e8 = &local_f8;
    local_108 = fmt::v7::to_string_view<char,_0>(local_d8);
    local_50 = &local_118;
    local_58 = local_e8;
    local_48 = local_e8;
    local_38 = local_e8;
    local_40 = local_50;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,4,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_e8->string);
    format_str.size_ = local_118.desc_;
    format_str.data_ = (char *)local_108.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_118.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_108.data_,format_str,args);
  }
  else {
    if (this->type != Edge) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"Unrecognized event control type",&local_181);
      InternalException::InternalException(this_00,&local_180);
      __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
    }
    if (this->edge == Posedge) {
      local_1a8 = (char (*) [8])0x420903;
    }
    else {
      local_1a8 = (char (*) [8])0x42090b;
    }
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
    ::operator()(&local_150,var_str,this->var);
    local_68 = "{0} {1}";
    local_70 = local_1a8;
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_150;
    local_60 = __return_storage_ptr__;
    fmt::v7::make_args_checked<char_const(&)[8],std::__cxx11::string,char[8],char>
              (&local_a8,(v7 *)"{0} {1}",local_1a8,
               (remove_reference_t<const_char_(&)[8]> *)&local_150,in_R8);
    local_80 = &local_a8;
    local_b8 = fmt::v7::to_string_view<char,_0>(local_68);
    local_28 = &local_c8;
    local_30 = local_80;
    local_20 = local_80;
    local_10 = local_80;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdc,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_80);
    format_str_00.size_ = local_c8.desc_;
    format_str_00.data_ = (char *)local_b8.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_c8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_b8.data_,format_str_00,args_00);
    std::__cxx11::string::~string((string *)&local_150);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EventControl::to_string(const std::function<std::string(const Var *)> &var_str) const {
    switch (type) {
        case EventControlType::Delay: {
            return ::format("#{0}", delay);
        }
        case EventControlType::Edge: {
            return ::format("{0} {1}", edge == EventEdgeType::Posedge ? "posedge" : "negedge",
                            var_str(var));
        }
    }
    throw InternalException("Unrecognized event control type");
}